

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

_Bool sysbvm_jit_emitObjectFileProgramEntityRecursiveName
                (sysbvm_bytecodeJit_t *jit,sysbvm_programEntity_t *programEntity)

{
  ulong uVar1;
  _Bool _Var2;
  size_t entryCount;
  char dot;
  undefined1 local_19;
  
  if (programEntity == (sysbvm_programEntity_t *)0x0) {
    _Var2 = false;
  }
  else {
    _Var2 = sysbvm_jit_emitObjectFileProgramEntityRecursiveName
                      (jit,(sysbvm_programEntity_t *)programEntity->owner);
    uVar1 = programEntity->name;
    if (((uVar1 & 0xf) == 0 && uVar1 != 0) && ((*(uint *)(uVar1 + 8) & 0x300) == 0x200)) {
      if (_Var2) {
        local_19 = 0x2e;
        sysbvm_dynarray_add(&jit->objectFileContent,&local_19);
      }
      uVar1 = programEntity->name;
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        entryCount = (size_t)*(uint *)(uVar1 + 0xc);
      }
      else {
        entryCount = 0;
      }
      sysbvm_dynarray_addAll(&jit->objectFileContent,entryCount,(void *)(uVar1 + 0x10));
      _Var2 = _Var2 || entryCount != 0;
    }
  }
  return _Var2;
}

Assistant:

static bool sysbvm_jit_emitObjectFileProgramEntityRecursiveName(sysbvm_bytecodeJit_t *jit, sysbvm_programEntity_t *programEntity)
{
    if(!programEntity)
        return false;

    bool hasEmittedName = sysbvm_jit_emitObjectFileProgramEntityRecursiveName(jit, (sysbvm_programEntity_t*)programEntity->owner);
    if(sysbvm_tuple_isBytes(programEntity->name))
    {
        if(hasEmittedName)
        {
            char dot = '.';
            sysbvm_dynarray_add(&jit->objectFileContent, &dot);
        }
        size_t byteSize = sysbvm_tuple_getSizeInBytes(programEntity->name);
        sysbvm_dynarray_addAll(&jit->objectFileContent, byteSize, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(programEntity->name)->bytes);
        hasEmittedName = hasEmittedName || byteSize > 0;
    }

    return hasEmittedName;
}